

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

bool __thiscall Core::fileCheck(Core *this,string *s)

{
  bool bVar1;
  string *__lhs;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *s_local;
  Core *this_local;
  
  local_20 = s;
  s_local = (string *)this;
  bVar1 = Parsing::File::setPath(&this->_f,s);
  if (bVar1) {
    __lhs = Parsing::File::getExtension_abi_cxx11_(&this->_f);
    bVar1 = std::operator!=(__lhs,"UWU");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"This not a UWU file!",&local_79);
      this_local._7_1_ = error(this,&local_78,false);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"There is NOWO file!",&local_41);
    this_local._7_1_ = error(this,&local_40,false);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Core::fileCheck(const std::string &s)
{
    if (!_f.setPath(s))
        return error("There is NOWO file!");

    if (_f.getExtension() != "UWU")
        return error("This not a UWU file!");

    return true;
}